

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

Limit __thiscall
google::protobuf::io::CodedInputStream::ReadLengthAndPushLimit(CodedInputStream *this)

{
  byte *pbVar1;
  Limit LVar2;
  int64_t iVar3;
  uint first_byte_or_zero;
  
  pbVar1 = this->buffer_;
  first_byte_or_zero = 0;
  if ((pbVar1 < this->buffer_end_) && (first_byte_or_zero = (uint)*pbVar1, -1 < (char)*pbVar1)) {
    this->buffer_ = pbVar1 + 1;
  }
  else {
    iVar3 = ReadVarint32Fallback(this,first_byte_or_zero);
    first_byte_or_zero = 0;
    if (-1 < iVar3) {
      first_byte_or_zero = (uint)iVar3;
    }
  }
  LVar2 = PushLimit(this,first_byte_or_zero);
  return LVar2;
}

Assistant:

CodedInputStream::Limit CodedInputStream::ReadLengthAndPushLimit() {
  uint32_t length;
  return PushLimit(ReadVarint32(&length) ? length : 0);
}